

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O2

void rsg::anon_unknown_18::deleteVectorElements<rsg::ShaderInput>
               (vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *vec)

{
  ShaderInput *this;
  pointer ppSVar1;
  pointer ppSVar2;
  
  for (ppSVar2 = (vec->super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar2 !=
      (vec->super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppSVar2 = ppSVar2 + 1) {
    this = *ppSVar2;
    if (this != (ShaderInput *)0x0) {
      ShaderInput::~ShaderInput(this);
    }
    operator_delete(this,0x38);
  }
  ppSVar1 = (vec->super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar2 != ppSVar1) {
    (vec->super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  return;
}

Assistant:

void deleteVectorElements (std::vector<T*>& vec)
{
	for (typename std::vector<T*>::iterator i = vec.begin(); i != vec.end(); i++)
		delete *i;
	vec.clear();
}